

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O1

bool __thiscall SQVM::Return(SQVM *this,SQInteger _arg0,SQInteger _arg1,SQObjectPtr *retval)

{
  SQUnsignedInteger *pSVar1;
  int iVar2;
  SQObjectType SVar3;
  SQObjectType SVar4;
  SQBool SVar5;
  long lVar6;
  SQTable *pSVar7;
  SQObjectPtr *pSVar8;
  long lVar9;
  
  SVar5 = this->ci->_root;
  lVar6 = this->_stackbase;
  iVar2 = this->ci->_prevstkbase;
  if ((this->_debughook == true) && (0 < this->ci->_ncalls)) {
    lVar9 = 0;
    do {
      CallDebugHook(this,0x72,0);
      lVar9 = lVar9 + 1;
    } while (lVar9 < this->ci->_ncalls);
  }
  if (SVar5 == 0) {
    lVar9 = (long)this->ci->_target;
    if (lVar9 == -1) {
      retval = (SQObjectPtr *)0x0;
    }
    else {
      retval = (this->_stack)._vals + (lVar6 - iVar2) + lVar9;
    }
  }
  if (retval != (SQObjectPtr *)0x0) {
    if (_arg0 == 0xff) {
      pSVar7 = (retval->super_SQObject)._unVal.pTable;
      SVar3 = (retval->super_SQObject)._type;
      (retval->super_SQObject)._type = OT_NULL;
      (retval->super_SQObject)._unVal.pTable = (SQTable *)0x0;
    }
    else {
      lVar6 = this->_stackbase;
      pSVar8 = (this->_stack)._vals;
      SVar3 = (retval->super_SQObject)._type;
      pSVar7 = (retval->super_SQObject)._unVal.pTable;
      (retval->super_SQObject)._unVal = pSVar8[lVar6 + _arg1].super_SQObject._unVal;
      SVar4 = pSVar8[lVar6 + _arg1].super_SQObject._type;
      (retval->super_SQObject)._type = SVar4;
      if ((SVar4 >> 0x1b & 1) != 0) {
        pSVar1 = &(((retval->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
    }
    if ((SVar3 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
  }
  LeaveFrame(this);
  return SVar5 != 0;
}

Assistant:

bool SQVM::Return(SQInteger _arg0, SQInteger _arg1, SQObjectPtr &retval)
{
    SQBool    _isroot      = ci->_root;
    SQInteger callerbase   = _stackbase - ci->_prevstkbase;

    if (_debughook) {
        for(SQInteger i=0; i<ci->_ncalls; i++) {
            CallDebugHook(_SC('r'));
        }
    }

    SQObjectPtr *dest;
    if (_isroot) {
        dest = &(retval);
    } else if (ci->_target == -1) {
        dest = NULL;
    } else {
        dest = &_stack._vals[callerbase + ci->_target];
    }
    if (dest) {
        if(_arg0 != 0xFF) {
            *dest = _stack._vals[_stackbase+_arg1];
        }
        else {
            dest->Null();
        }
        //*dest = (_arg0 != 0xFF) ? _stack._vals[_stackbase+_arg1] : _null_;
    }
    LeaveFrame();
    return _isroot ? true : false;
}